

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O0

ChainstateLoadResult *
node::CompleteChainstateInitialization
          (ChainstateManager *chainman,CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  ConstevalStringLiteral str_01;
  ConstevalStringLiteral str_02;
  ConstevalStringLiteral str_03;
  ConstevalStringLiteral str_04;
  ConstevalStringLiteral str_05;
  ConstevalStringLiteral str_06;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  CBlockIndex *pCVar2;
  reference ppCVar3;
  iterator iVar4;
  iterator iVar5;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  Chainstate *chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range1;
  double init_cache_fraction;
  unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *pblocktree;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  iterator __end1;
  iterator __begin1;
  anon_class_8_1_38e0b97e is_coinsview_empty;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  char *in_stack_fffffffffffffa00;
  ChainstateManager *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  BlockManager *in_stack_fffffffffffffa18;
  CCoinsViewDB *in_stack_fffffffffffffa20;
  path *in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  Chainstate *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined1 in_stack_fffffffffffffa4c;
  undefined1 in_stack_fffffffffffffa4d;
  undefined1 in_stack_fffffffffffffa4e;
  undefined1 in_stack_fffffffffffffa4f;
  CCoinsViewDB *in_stack_fffffffffffffa50;
  bilingual_str *in_stack_fffffffffffffa58;
  Chainstate *in_stack_fffffffffffffa60;
  Chainstate *pCVar7;
  ulong in_stack_fffffffffffffa68;
  int source_line;
  undefined6 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa76;
  undefined1 in_stack_fffffffffffffa77;
  ConstevalFormatString<1U> fmt;
  Chainstate *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  Chainstate *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  int local_504;
  Chainstate *in_stack_fffffffffffffb80;
  Level in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  undefined8 local_18;
  byte local_10;
  byte local_f;
  undefined1 local_e;
  undefined1 local_d;
  _Base_ptr local_8;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),(pointer)0x1128e02);
  fmt.fmt = &stack0xffffffffffffff70;
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 (path *)0x1128e36);
  fs::operator/((path *)in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08);
  fs::operator/((path *)in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08);
  local_18 = *in_RDX;
  local_10 = *(byte *)(in_RCX + 8) & 1;
  local_f = *(byte *)(in_RCX + 10) & 1;
  local_e = 0;
  local_d = *(undefined1 *)(in_RSI + 0x7b8);
  std::make_unique<kernel::BlockTreeDB,DBParams>((DBParams *)in_stack_fffffffffffffa20);
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator=
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             in_stack_fffffffffffffa08,
             (unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             in_stack_fffffffffffffa00);
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::~unique_ptr
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             in_stack_fffffffffffffa08);
  DBParams::~DBParams((DBParams *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if ((*(byte *)(in_RCX + 10) & 1) != 0) {
    std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator->
              ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    kernel::BlockTreeDB::WriteReindexing
              ((BlockTreeDB *)in_stack_fffffffffffffa10,
               SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),false);
    if ((*(byte *)(in_RCX + 0xc) & 1) != 0) {
      BlockManager::CleanupBlockRevFiles
                ((BlockManager *)
                 CONCAT17(in_stack_fffffffffffffa77,
                          CONCAT16(in_stack_fffffffffffffa76,in_stack_fffffffffffffa70)));
    }
  }
  bVar1 = util::SignalInterrupt::operator_cast_to_bool
                    ((SignalInterrupt *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if (bVar1) {
    std::__cxx11::string::string(in_stack_fffffffffffffa10);
    std::__cxx11::string::string(in_stack_fffffffffffffa10);
    std::tuple<node::ChainstateLoadStatus,_bilingual_str>::tuple<true,_true>
              ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08,
               (ChainstateLoadStatus *)in_stack_fffffffffffffa00,
               (bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  }
  else {
    bVar1 = ChainstateManager::LoadBlockIndex(in_RDI);
    if (bVar1) {
      ChainstateManager::BlockIndex(in_stack_fffffffffffffa08);
      bVar1 = std::
              unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
              ::empty((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      if (!bVar1) {
        ChainstateManager::GetConsensus
                  ((ChainstateManager *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        pCVar2 = BlockManager::LookupBlockIndex
                           (in_stack_fffffffffffffa18,(uint256 *)in_stack_fffffffffffffa10);
        if (pCVar2 == (CBlockIndex *)0x0) {
          str_00.lit._4_1_ = in_stack_fffffffffffffa4c;
          str_00.lit._0_4_ = in_stack_fffffffffffffa48;
          str_00.lit._5_1_ = in_stack_fffffffffffffa4d;
          str_00.lit._6_1_ = in_stack_fffffffffffffa4e;
          str_00.lit._7_1_ = in_stack_fffffffffffffa4f;
          ::_(str_00);
          std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
          tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                    ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08,
                     (ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                     (bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
          ;
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
          ;
          goto LAB_01129c43;
        }
      }
      if (((*(byte *)(in_RSI + 0xa50) & 1) == 0) || ((*(byte *)(in_RCX + 0xc) & 1) != 0)) {
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffa10);
        if (bVar1) {
          ChainstateManager::ActiveChainstate(in_stack_fffffffffffffa08);
          bVar1 = Chainstate::LoadGenesisBlock(in_stack_fffffffffffffac0);
          if (!bVar1) {
            str_02.lit._4_1_ = in_stack_fffffffffffffa4c;
            str_02.lit._0_4_ = in_stack_fffffffffffffa48;
            str_02.lit._5_1_ = in_stack_fffffffffffffa4d;
            str_02.lit._6_1_ = in_stack_fffffffffffffa4e;
            str_02.lit._7_1_ = in_stack_fffffffffffffa4f;
            ::_(str_02);
            std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
            tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                      ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08
                       ,(ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                       (bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            goto LAB_01129c43;
          }
        }
        if (*(long *)(in_RSI + 0xcf0) < 1) {
          __assert_fail("chainman.m_total_coinstip_cache > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0x5f,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        if (*(long *)(in_RSI + 0xcf8) < 1) {
          __assert_fail("chainman.m_total_coinsdb_cache > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0x60,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        ChainstateManager::GetAll
                  ((ChainstateManager *)
                   CONCAT17(in_stack_fffffffffffffa4f,
                            CONCAT16(in_stack_fffffffffffffa4e,
                                     CONCAT15(in_stack_fffffffffffffa4d,
                                              CONCAT14(in_stack_fffffffffffffa4c,
                                                       in_stack_fffffffffffffa48)))));
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffa00)
        ;
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffa00)
        ;
        while( true ) {
          source_line = (int)(in_stack_fffffffffffffa68 >> 0x20);
          bVar1 = __gnu_cxx::
                  operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                            ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                              *)in_stack_fffffffffffffa08,
                             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                              *)in_stack_fffffffffffffa00);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          ppCVar3 = __gnu_cxx::
                    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                    ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          pCVar7 = *ppCVar3;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa18,
                     (char *)in_stack_fffffffffffffa10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa18,
                     (char *)in_stack_fffffffffffffa10);
          Chainstate::ToString_abi_cxx11_(in_stack_fffffffffffffa40);
          in_stack_fffffffffffffa08 = (ChainstateManager *)&stack0xfffffffffffffdd0;
          in_stack_fffffffffffffa00 = "Initializing chainstate %s\n";
          in_stack_fffffffffffff9f8 = 2;
          logging_function._M_str = in_stack_fffffffffffffac8;
          logging_function._M_len = (size_t)in_stack_fffffffffffffac0;
          source_file._M_str = in_stack_fffffffffffffab8;
          source_file._M_len = (size_t)in_stack_fffffffffffffab0;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,source_line,(LogFlags)in_stack_fffffffffffffa60,
                     in_stack_fffffffffffffba0,fmt,in_stack_fffffffffffffbb0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          dVar6 = (double)*(long *)(in_RSI + 0xcf8) * 0.2;
          in_stack_fffffffffffffa68 = (ulong)dVar6;
          in_stack_fffffffffffffa68 =
               in_stack_fffffffffffffa68 |
               (long)(dVar6 - 9.223372036854776e+18) & (long)in_stack_fffffffffffffa68 >> 0x3f;
          fs::path::path((path *)0x11295e4,
                         (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          Chainstate::InitCoinsDB
                    (in_stack_fffffffffffffa40,
                     CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                     SUB81((ulong)in_stack_fffffffffffffa30 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffa30 >> 0x30,0),in_stack_fffffffffffffa28);
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          bVar1 = std::function::operator_cast_to_bool
                            ((function<void_()> *)
                             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          in_stack_fffffffffffffa60 = pCVar7;
          if (bVar1) {
            in_stack_fffffffffffffa58 =
                 (bilingual_str *)
                 Chainstate::CoinsErrorCatcher((Chainstate *)in_stack_fffffffffffffa08);
            std::function<void_()>::function
                      ((function<void_()> *)in_stack_fffffffffffffa18,
                       (function<void_()> *)in_stack_fffffffffffffa10);
            CCoinsViewErrorCatcher::AddReadErrCallback
                      ((CCoinsViewErrorCatcher *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       (function<void_()> *)0x112967b);
            std::function<void_()>::~function
                      ((function<void_()> *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            in_stack_fffffffffffffa60 = pCVar7;
          }
          in_stack_fffffffffffffa50 = Chainstate::CoinsDB((Chainstate *)in_stack_fffffffffffffa08);
          in_stack_fffffffffffffa4f = CCoinsViewDB::NeedsUpgrade(in_stack_fffffffffffffa20);
          if ((bool)in_stack_fffffffffffffa4f) {
            str_03.lit._4_1_ = in_stack_fffffffffffffa4c;
            str_03.lit._0_4_ = in_stack_fffffffffffffa48;
            str_03.lit._5_1_ = in_stack_fffffffffffffa4d;
            str_03.lit._6_1_ = in_stack_fffffffffffffa4e;
            str_03.lit._7_1_ = (bool)in_stack_fffffffffffffa4f;
            ::_(str_03);
            std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
            tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                      ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08
                       ,(ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                       (bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            local_504 = 1;
            goto LAB_011299e4;
          }
          in_stack_fffffffffffffa4e = Chainstate::ReplayBlocks(in_stack_fffffffffffffb80);
          if (!(bool)in_stack_fffffffffffffa4e) {
            str_04.lit._4_1_ = in_stack_fffffffffffffa4c;
            str_04.lit._0_4_ = in_stack_fffffffffffffa48;
            str_04.lit._5_1_ = in_stack_fffffffffffffa4d;
            str_04.lit._6_1_ = (bool)in_stack_fffffffffffffa4e;
            str_04.lit._7_1_ = in_stack_fffffffffffffa4f;
            ::_(str_04);
            std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
            tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                      ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08
                       ,(ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                       (bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            local_504 = 1;
            goto LAB_011299e4;
          }
          Chainstate::InitCoinsCache
                    ((Chainstate *)in_stack_fffffffffffffa08,(size_t)in_stack_fffffffffffffa00);
          in_stack_fffffffffffffa4d =
               Chainstate::CanFlushToDisk((Chainstate *)in_stack_fffffffffffffa08);
          if (!(bool)in_stack_fffffffffffffa4d) {
            __assert_fail("chainstate->CanFlushToDisk()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                          ,0x86,
                          "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                         );
          }
          in_stack_fffffffffffffa4c =
               CompleteChainstateInitialization::anon_class_8_1_38e0b97e::operator()
                         ((anon_class_8_1_38e0b97e *)in_stack_fffffffffffffa08,
                          (Chainstate *)in_stack_fffffffffffffa00);
          if (!(bool)in_stack_fffffffffffffa4c) {
            bVar1 = Chainstate::LoadChainTip(in_stack_fffffffffffffab0);
            in_stack_fffffffffffffa48 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa48);
            if (!bVar1) {
              str_05.lit._4_1_ = in_stack_fffffffffffffa4c;
              str_05.lit._0_4_ = in_stack_fffffffffffffa48;
              str_05.lit._5_1_ = in_stack_fffffffffffffa4d;
              str_05.lit._6_1_ = in_stack_fffffffffffffa4e;
              str_05.lit._7_1_ = in_stack_fffffffffffffa4f;
              ::_(str_05);
              std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
              tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                        ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                         in_stack_fffffffffffffa08,(ChainstateLoadStatus *)in_stack_fffffffffffffa00
                         ,(bilingual_str *)
                          CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              local_504 = 1;
              goto LAB_011299e4;
            }
            in_stack_fffffffffffffa40 =
                 (Chainstate *)CChain::Tip((CChain *)in_stack_fffffffffffffa08);
            if (in_stack_fffffffffffffa40 == (Chainstate *)0x0) {
              __assert_fail("chainstate->m_chain.Tip() != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                            ,0x8d,
                            "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                           );
            }
          }
          __gnu_cxx::
          __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
          ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        }
        local_504 = 2;
LAB_011299e4:
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffa08)
        ;
        if (local_504 != 1) {
          if ((*(byte *)(in_RCX + 10) & 1) == 0) {
            ChainstateManager::GetAll
                      ((ChainstateManager *)
                       CONCAT17(in_stack_fffffffffffffa4f,
                                CONCAT16(in_stack_fffffffffffffa4e,
                                         CONCAT15(in_stack_fffffffffffffa4d,
                                                  CONCAT14(in_stack_fffffffffffffa4c,
                                                           in_stack_fffffffffffffa48)))));
            iVar4 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                               in_stack_fffffffffffffa00);
            iVar5 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                               in_stack_fffffffffffffa00);
            bVar1 = std::
                    any_of<__gnu_cxx::__normal_iterator<Chainstate**,std::vector<Chainstate*,std::allocator<Chainstate*>>>,node::CompleteChainstateInitialization(ChainstateManager&,node::CacheSizes_const&,node::ChainstateLoadOptions_const&)::__0>
                              (iVar4._M_current,iVar5._M_current);
            in_stack_fffffffffffffa3f = bVar1;
            if (bVar1) {
              str_06.lit._4_1_ = in_stack_fffffffffffffa4c;
              str_06.lit._0_4_ = in_stack_fffffffffffffa48;
              str_06.lit._5_1_ = in_stack_fffffffffffffa4d;
              str_06.lit._6_1_ = in_stack_fffffffffffffa4e;
              str_06.lit._7_1_ = in_stack_fffffffffffffa4f;
              ::_(str_06);
              ChainstateManager::GetConsensus
                        ((ChainstateManager *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              tinyformat::format<int>(in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
              std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
              tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                        ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)
                         in_stack_fffffffffffffa08,(ChainstateLoadStatus *)in_stack_fffffffffffffa00
                         ,(bilingual_str *)
                          CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            }
            std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                      ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                       in_stack_fffffffffffffa08);
            if (bVar1) goto LAB_01129c43;
          }
          ChainstateManager::MaybeRebalanceCaches
                    ((ChainstateManager *)
                     CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
          std::__cxx11::string::string(in_stack_fffffffffffffa10);
          std::__cxx11::string::string(in_stack_fffffffffffffa10);
          std::tuple<node::ChainstateLoadStatus,_bilingual_str>::tuple<true,_true>
                    ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08,
                     (ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                     (bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
          ;
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
          ;
        }
      }
      else {
        str_01.lit._4_1_ = in_stack_fffffffffffffa4c;
        str_01.lit._0_4_ = in_stack_fffffffffffffa48;
        str_01.lit._5_1_ = in_stack_fffffffffffffa4d;
        str_01.lit._6_1_ = in_stack_fffffffffffffa4e;
        str_01.lit._7_1_ = in_stack_fffffffffffffa4f;
        ::_(str_01);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08,
                   (ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                   (bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      }
    }
    else {
      bVar1 = util::SignalInterrupt::operator_cast_to_bool
                        ((SignalInterrupt *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      if (bVar1) {
        std::__cxx11::string::string(in_stack_fffffffffffffa10);
        std::__cxx11::string::string(in_stack_fffffffffffffa10);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::tuple<true,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08,
                   (ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                   (bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      }
      else {
        str.lit._4_1_ = in_stack_fffffffffffffa4c;
        str.lit._0_4_ = in_stack_fffffffffffffa48;
        str.lit._5_1_ = in_stack_fffffffffffffa4d;
        str.lit._6_1_ = in_stack_fffffffffffffa4e;
        str.lit._7_1_ = in_stack_fffffffffffffa4f;
        ::_(str);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffa08,
                   (ChainstateLoadStatus *)in_stack_fffffffffffffa00,
                   (bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      }
    }
  }
LAB_01129c43:
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ChainstateLoadResult *)in_RDI;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    auto& pblocktree{chainman.m_blockman.m_block_tree_db};
    // new BlockTreeDB tries to delete the existing file, which
    // fails if it's still open from the previous loop. Close it first:
    pblocktree.reset();
    pblocktree = std::make_unique<BlockTreeDB>(DBParams{
        .path = chainman.m_options.datadir / "blocks" / "index",
        .cache_bytes = static_cast<size_t>(cache_sizes.block_tree_db),
        .memory_only = options.block_tree_db_in_memory,
        .wipe_data = options.wipe_block_tree_db,
        .options = chainman.m_options.block_tree_db});

    if (options.wipe_block_tree_db) {
        pblocktree->WriteReindexing(true);
        chainman.m_blockman.m_blockfiles_indexed = false;
        //If we're reindexing in prune mode, wipe away unusable block files and all undo data files
        if (options.prune) {
            chainman.m_blockman.CleanupBlockRevFiles();
        }
    }

    if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};

    // LoadBlockIndex will load m_have_pruned if we've ever removed a
    // block file from disk.
    // Note that it also sets m_blockfiles_indexed based on the disk flag!
    if (!chainman.LoadBlockIndex()) {
        if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};
        return {ChainstateLoadStatus::FAILURE, _("Error loading block database")};
    }

    if (!chainman.BlockIndex().empty() &&
            !chainman.m_blockman.LookupBlockIndex(chainman.GetConsensus().hashGenesisBlock)) {
        // If the loaded chain has a wrong genesis, bail out immediately
        // (we're likely using a testnet datadir, or the other way around).
        return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Incorrect or no genesis block found. Wrong datadir for network?")};
    }

    // Check for changed -prune state.  What we are concerned about is a user who has pruned blocks
    // in the past, but is now trying to run unpruned.
    if (chainman.m_blockman.m_have_pruned && !options.prune) {
        return {ChainstateLoadStatus::FAILURE, _("You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain")};
    }

    // At this point blocktree args are consistent with what's on disk.
    // If we're not mid-reindex (based on disk + args), add a genesis block on disk
    // (otherwise we use the one already on disk).
    // This is called again in ImportBlocks after the reindex completes.
    if (chainman.m_blockman.m_blockfiles_indexed && !chainman.ActiveChainstate().LoadGenesisBlock()) {
        return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
    }

    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    assert(chainman.m_total_coinstip_cache > 0);
    assert(chainman.m_total_coinsdb_cache > 0);

    // Conservative value which is arbitrarily chosen, as it will ultimately be changed
    // by a call to `chainman.MaybeRebalanceCaches()`. We just need to make sure
    // that the sum of the two caches (40%) does not exceed the allowable amount
    // during this temporary initialization state.
    double init_cache_fraction = 0.2;

    // At this point we're either in reindex or we've loaded a useful
    // block tree into BlockIndex()!

    for (Chainstate* chainstate : chainman.GetAll()) {
        LogPrintf("Initializing chainstate %s\n", chainstate->ToString());

        chainstate->InitCoinsDB(
            /*cache_size_bytes=*/chainman.m_total_coinsdb_cache * init_cache_fraction,
            /*in_memory=*/options.coins_db_in_memory,
            /*should_wipe=*/options.wipe_chainstate_db);

        if (options.coins_error_cb) {
            chainstate->CoinsErrorCatcher().AddReadErrCallback(options.coins_error_cb);
        }

        // Refuse to load unsupported database format.
        // This is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (chainstate->CoinsDB().NeedsUpgrade()) {
            return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Unsupported chainstate database format found. "
                                                                     "Please restart with -reindex-chainstate. This will "
                                                                     "rebuild the chainstate database.")};
        }

        // ReplayBlocks is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (!chainstate->ReplayBlocks()) {
            return {ChainstateLoadStatus::FAILURE, _("Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate.")};
        }

        // The on-disk coinsdb is now in a good state, create the cache
        chainstate->InitCoinsCache(chainman.m_total_coinstip_cache * init_cache_fraction);
        assert(chainstate->CanFlushToDisk());

        if (!is_coinsview_empty(chainstate)) {
            // LoadChainTip initializes the chain based on CoinsTip()'s best block
            if (!chainstate->LoadChainTip()) {
                return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
            }
            assert(chainstate->m_chain.Tip() != nullptr);
        }
    }

    if (!options.wipe_block_tree_db) {
        auto chainstates{chainman.GetAll()};
        if (std::any_of(chainstates.begin(), chainstates.end(),
                        [](const Chainstate* cs) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return cs->NeedsRedownload(); })) {
            return {ChainstateLoadStatus::FAILURE, strprintf(_("Witness data for blocks after height %d requires validation. Please restart with -reindex."),
                                                             chainman.GetConsensus().SegwitHeight)};
        };
    }

    // Now that chainstates are loaded and we're able to flush to
    // disk, rebalance the coins caches to desired levels based
    // on the condition of each chainstate.
    chainman.MaybeRebalanceCaches();

    return {ChainstateLoadStatus::SUCCESS, {}};
}